

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptStackWalker::Walk(JavascriptStackWalker *this,bool includeInlineFrames)

{
  byte bVar1;
  ushort uVar2;
  size_t sVar3;
  ScriptEntryExitRecord *pSVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  CallInfo CVar8;
  JavascriptFunction *pJVar9;
  
  this->interpreterFrame = (InterpreterStackFrame *)0x0;
  if (((this->lastInternalFrameInfo).codeAddress != (void *)0x0) &&
     ((char)*(ushort *)&this->field_0x50 < '\0')) {
    *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xff7f;
    (this->lastInternalFrameInfo).codeAddress = (void *)0x0;
    (this->lastInternalFrameInfo).framePointer = (void *)0x0;
    (this->lastInternalFrameInfo).stackCheckCodeHeight = 0xffffffff;
    (this->lastInternalFrameInfo).frameType = InternalFrameType_None;
    (this->lastInternalFrameInfo).function = (JavascriptFunction *)0x0;
    (this->lastInternalFrameInfo).hasInlinedFramesOnStack = false;
    (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout = false;
  }
  uVar2 = *(ushort *)&this->field_0x50;
  if ((uVar2 & 1) != 0) {
    if (!includeInlineFrames) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x2d4,"(includeInlineFrames)","includeInlineFrames");
      if (!bVar6) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar7 = 0;
    }
    bVar6 = InlinedFrameWalker::Next(&this->inlinedFrameWalker,&this->inlinedFrameCallInfo);
    *(ushort *)&this->field_0x50 = (ushort)*(undefined4 *)&this->field_0x50 & 0xfffe | (ushort)bVar6
    ;
    if (!bVar6) {
      (this->inlinedFrameWalker).parentFunction = (ScriptFunction *)0x0;
      Memory::DeleteArray<Memory::HeapAllocator,Js::InlinedFrameWalker::InlinedFrame*>
                (&Memory::HeapAllocator::Instance,(long)(this->inlinedFrameWalker).frameCount,
                 (this->inlinedFrameWalker).frames);
      (this->inlinedFrameWalker).frames = (InlinedFrame **)0x0;
      (this->inlinedFrameWalker).currentIndex = -1;
      (this->inlinedFrameWalker).frameCount = 0;
      CVar8 = GetCallInfo(this,false);
      if (CVar8._0_4_ < 0) {
        pJVar9 = GetCurrentFunction(this,false);
        uVar2 = *(ushort *)&this->field_0x50;
        if ((this->lastInternalFrameInfo).codeAddress == (void *)0x0) {
          sVar3 = (this->currentFrame).stackCheckCodeHeight;
          (this->lastInternalFrameInfo).codeAddress = (this->currentFrame).codeAddr;
          (this->lastInternalFrameInfo).framePointer = (this->currentFrame).frame;
          (this->lastInternalFrameInfo).stackCheckCodeHeight = sVar3;
          (this->lastInternalFrameInfo).frameType = InternalFrameType_LoopBody;
          (this->lastInternalFrameInfo).function = pJVar9;
          (this->lastInternalFrameInfo).hasInlinedFramesOnStack = true;
          (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout =
               (bool)((byte)uVar2 >> 6 & 1);
        }
        *(ushort *)&this->field_0x50 = uVar2 & 0xfffb;
        return 1;
      }
      return 1;
    }
    return 1;
  }
  *(ushort *)&this->field_0x50 = uVar2 & 0xfffd;
  if ((uVar2 & 0x10) == 0) {
    bVar6 = Amd64StackFrame::Next(&this->currentFrame);
    if (!bVar6) {
      this->field_0x50 = this->field_0x50 & 0xfb;
      return 0;
    }
  }
  else {
    *(ushort *)&this->field_0x50 = uVar2 & 0xffed;
  }
  pSVar4 = this->entryExitRecord;
  if ((this->currentFrame).addressOfCodeAddr != pSVar4->addrOfReturnAddrOfScriptEntryFunction) {
LAB_00afa7ce:
    UpdateFrame(this,includeInlineFrames);
    return 1;
  }
  bVar1 = *(byte *)pSVar4;
  pSVar4 = pSVar4->next;
  this->entryExitRecord = pSVar4;
  if (pSVar4 == (ScriptEntryExitRecord *)0x0) {
    uVar2 = 0xfffb;
  }
  else {
    if ((((bVar1 | (byte)(*(ushort *)&this->field_0x50 >> 8)) & 1) != 0) ||
       (this->scriptContext->isDiagnosticsScriptContext != false)) {
      this->scriptContext = pSVar4->scriptContext;
      Amd64StackFrame::SkipToFrame(&this->currentFrame,pSVar4->frameIdOfScriptExitFunction);
      goto LAB_00afa7ce;
    }
    uVar2 = 0xfefb;
  }
  *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & uVar2;
  return 0;
}

Assistant:

BOOL JavascriptStackWalker::Walk(bool includeInlineFrames)
    {
        // Walk one frame up the call stack.
        this->interpreterFrame = NULL;

#if ENABLE_NATIVE_CODEGEN
        if (lastInternalFrameInfo.codeAddress != nullptr && this->previousInterpreterFrameIsForLoopBody)
        {
            this->previousInterpreterFrameIsForLoopBody = false;
            ClearCachedInternalFrameInfo();
        }

        if (inlinedFramesBeingWalked)
        {
            Assert(includeInlineFrames);
            inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
            if (!inlinedFramesBeingWalked)
            {
                inlinedFrameWalker.Close();
                if ((this->IsCurrentPhysicalFrameForLoopBody()))
                {
                    // Done walking inlined frames in a loop body, cache the native code address now
                    // in order to skip the loop body frame.
                    this->SetCachedInternalFrameInfo(InternalFrameType_LoopBody, this->GetCurrentFunctionFromPhysicalFrame(), true /*hasInlinedFramesOnStack*/, previousInterpreterFrameIsFromBailout);
                    isJavascriptFrame = false;
                }
            }

            return true;
        }
#endif
        this->hasInlinedFramesOnStack = false;
        if (this->isInitialFrame)
        {
            this->isInitialFrame = false; // Only walk initial frame once
        }
        else if (!this->currentFrame.Next())
        {
            this->isJavascriptFrame = false;
            return false;
        }

        // If we're at the entry from a host frame, hop to the frame from which we left the script.
        if (AlignAndCheckAddressOfReturnAddressMatch(this->currentFrame.GetAddressOfInstructionPointer(), this->entryExitRecord->addrOfReturnAddrOfScriptEntryFunction))
        {
            BOOL hasCaller = this->entryExitRecord->hasCaller || this->forceFullWalk;

#ifdef CHECK_STACKWALK_EXCEPTION
            BOOL ignoreStackWalkException = this->entryExitRecord->ignoreStackWalkException;
#endif

            this->entryExitRecord = this->entryExitRecord->next;
            if (this->entryExitRecord == NULL)
            {
                this->isJavascriptFrame = false;
                return false;
            }

            if (!hasCaller && !this->scriptContext->IsDiagnosticsScriptContext())
            {
#ifdef CHECK_STACKWALK_EXCEPTION
                if (!ignoreStackWalkException)
                {
                    AssertMsg(false, "walk pass no caller frame");
                }
#endif
                this->isJavascriptFrame = false;
                return false;
            }

            this->scriptContext = this->entryExitRecord->scriptContext;
            this->currentFrame.SkipToFrame(this->entryExitRecord->frameIdOfScriptExitFunction);
        }

        this->UpdateFrame(includeInlineFrames);
        return true;
    }